

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ps2raster.cpp
# Opt level: O2

Raster * rw::ps2::rasterCreate(Raster *raster)

{
  uint uVar1;
  ulong uVar2;
  int iVar3;
  byte bVar4;
  int i;
  int32 iVar5;
  uint uVar6;
  int iVar7;
  int iVar8;
  uint uVar9;
  uint uVar10;
  uint32 uVar11;
  uint32 uVar12;
  long lVar13;
  long lVar14;
  ulong uVar15;
  uint64 uVar16;
  long *plVar17;
  ulong uVar18;
  ulong uVar19;
  ulong uVar20;
  ulong uVar21;
  Raster *pRVar22;
  byte bVar23;
  uint uVar24;
  uint uVar25;
  uint32 uVar26;
  ulong uVar27;
  undefined1 *puVar28;
  int iVar29;
  long lVar30;
  byte bVar31;
  ulong uVar32;
  uint uVar33;
  uint uVar34;
  uint uVar35;
  uint uVar36;
  uint uVar37;
  int iVar38;
  uint uVar39;
  ulong uVar40;
  uint32 uVar41;
  int iVar42;
  uint uVar43;
  ulong uVar44;
  undefined8 *puVar45;
  uint8 *puVar46;
  int iVar47;
  uint uVar48;
  long lVar49;
  long *plVar50;
  int iVar51;
  uint uVar52;
  long lVar53;
  uint uVar54;
  byte bVar55;
  int iVar56;
  uint uVar57;
  int iVar58;
  uint64 uVar59;
  ulong uVar60;
  bool bVar61;
  ulong uStack_290;
  ulong local_288;
  ulong local_280;
  ulong local_260;
  ulong local_258;
  int local_23c;
  int local_230;
  ulong local_200;
  ulong local_1f8;
  uint64 bufferBase [7];
  byte local_188;
  uint32 bufferPage_B [8];
  uint64 bufferWidth [7];
  uint32 bufferHeight_P [8];
  uint auStack_d8 [10];
  undefined8 local_b0;
  ulong local_a8;
  ulong local_a0;
  uint32 trxpos_hi [8];
  uint32 heightstack_Px [8];
  uint32 widthstack_Px [8];
  
  iVar5 = getRasterFormat(raster);
  if (iVar5 == 0) {
    return (Raster *)0x0;
  }
  raster->pixels = (uint8 *)0x0;
  raster->palette = (uint8 *)0x0;
  uVar25 = raster->width;
  local_258 = (ulong)uVar25;
  uVar52 = raster->height;
  uVar21 = (ulong)uVar52;
  raster->originalWidth = uVar25;
  raster->originalHeight = uVar52;
  raster->originalPixels = (uint8 *)0x0;
  if (uVar52 == 0 || uVar25 == 0) {
    raster->flags = 0x80;
    raster->stride = 0;
    raster->originalStride = 0;
    return raster;
  }
  pRVar22 = (Raster *)0x0;
  switch(raster->type) {
  case 0:
  case 4:
    lVar30 = (long)nativeRasterOffset;
    uVar34 = raster->format;
    iVar29 = raster->depth;
    lVar13 = (long)iVar29;
    *(undefined1 *)((long)&raster->pixels + lVar30 + 4) = 0;
    *(undefined8 *)((long)&raster->palette + lVar30) = 0;
    *(undefined4 *)((long)&raster->originalPixels + lVar30) = 0;
    if ((raster->flags & 0x80) != 0) {
      return raster;
    }
    uVar33 = uVar34 & 0xf00;
    uVar1 = *(uint *)(&DAT_0013441c + lVar13 * 4);
    iVar58 = *(int *)(rasterCreateTexture(rw::Raster*)::pageWidths + lVar13 * 4 + 0x7c);
    uVar18 = 0;
    for (iVar38 = 1; iVar38 < (int)uVar25; iVar38 = iVar38 * 2) {
      uVar18 = uVar18 + 0x4000000;
    }
    uVar27 = 0;
    for (iVar38 = 1; iVar38 < (int)uVar52; iVar38 = iVar38 * 2) {
      uVar27 = uVar27 + 0x40000000;
    }
    *(undefined2 *)((long)&raster->privateFlags + lVar30) = (undefined2)defaultMipMapKL;
    uVar6 = uVar1;
    if ((int)uVar1 < (int)uVar25) {
      uVar6 = uVar25;
    }
    iVar56 = 0x40;
    uVar24 = uVar34 >> 0xd & 3;
    iVar8 = 0;
    iVar38 = 2;
    pRVar22 = (Raster *)0x0;
    switch(uVar24) {
    case 0:
      local_b0 = CONCAT71((int7)((ulong)((long)&switchD_0012376a::switchdataD_0013436c +
                                        (long)(int)(&switchD_0012376a::switchdataD_0013436c)[uVar24]
                                        ) >> 8),1);
      if (uVar33 == 0x100) {
        local_280 = 10;
        iVar8 = 0;
        iVar56 = 0;
        iVar38 = 0;
        iVar3 = 0;
        local_230 = 0;
        local_1f8 = 0;
        goto LAB_001238d6;
      }
      if (uVar33 == 0x500) {
        iVar56 = 0;
        iVar38 = 0;
        iVar3 = 0;
        local_230 = 0;
        local_1f8 = 0;
        lVar53 = 0;
        local_200 = 0x400000000;
        local_280 = 0;
      }
      else {
        if (uVar33 != 0x600) {
          return (Raster *)0x0;
        }
        local_280 = 1;
        iVar8 = 0;
        iVar56 = 0;
        iVar38 = 0;
        iVar3 = 0;
        local_230 = 0;
        local_1f8 = 0;
        lVar53 = 0;
        local_200 = 0;
      }
      goto LAB_001238eb;
    case 1:
      local_280 = 0x13;
      iVar3 = 0x10;
      local_230 = 0x10;
      break;
    case 2:
      local_230 = 8;
      local_280 = 0x14;
      iVar3 = 2;
      break;
    case 3:
      goto switchD_00123688_caseD_3;
    }
    local_b0 = 0;
    if (uVar33 == 0x100) {
      local_1f8 = 0x2000000000000000;
      lVar53 = 10;
      local_200 = 0x400000000;
      iVar8 = iVar56;
    }
    else {
      if (uVar33 != 0x500) {
        return (Raster *)0x0;
      }
      local_1f8 = 0x2000000000000000;
      iVar8 = 0x20;
      local_b0 = 1;
      iVar38 = 4;
LAB_001238d6:
      local_200 = 0x400000000;
      lVar53 = 0;
    }
LAB_001238eb:
    for (lVar14 = 0; lVar14 != 7; lVar14 = lVar14 + 1) {
      bufferWidth[lVar14] = 1;
      bufferBase[lVar14] = 0;
    }
    iVar7 = (int)(iVar29 * uVar25) / 8;
    raster->stride = iVar7;
    uVar33 = (uint)local_280;
    if ((short)uVar34 < 0) {
      *(undefined4 *)((long)&raster->stride + lVar30) = 0;
      uVar34 = 0;
      local_188 = 0xfc;
      lVar14 = 0;
      uVar35 = 0;
      uVar24 = 0;
      uVar32 = uVar21;
      uVar16 = (long)((int)uVar6 / 0x40);
      uVar40 = local_258;
      while ((((uVar39 = (uint)uVar40, uVar39 != 0 && (iVar8 = (int)uVar32, iVar8 != 0)) &&
              (lVar14 < maxMipLevels)) &&
             (((int)uVar52 < 8 || (int)uVar25 < 8 || ((7 < (int)uVar39 && (7 < iVar8))))))) {
        uVar34 = uVar34 + ((int)(uVar39 * iVar29 * iVar8) / 8 + 0x3fU & 0xffffffc0);
        uVar54 = uVar39;
        if ((int)uVar39 < (int)uVar1) {
          uVar54 = uVar1;
        }
        *(uint *)((long)&raster->stride + lVar30) = uVar34;
        uVar59 = (uint64)((int)uVar54 / 0x40);
        bufferWidth[lVar14] = uVar59;
        if (uVar16 != uVar59) {
          bVar31 = (char)lVar14 - 1;
          uVar24 = ((((int)uVar52 >> (bVar31 & 0x1f)) + iVar58 + -1) / iVar58) *
                   ((int)(((int)uVar25 >> (bVar31 & 0x1f)) + (uVar1 - 1)) / (int)uVar1) * 0x800 +
                   uVar35 & 0xfffff800;
        }
        uVar35 = uVar24;
        uVar24 = uVar35 + 0x3f >> 8 & 7;
        if (local_280 < 0x15) {
          puVar28 = rasterCreateTexture(rw::Raster*)::blockOffset32_24_8;
          if ((0x80003UL >> local_280 & 1) == 0) {
            if ((0x100004UL >> local_280 & 1) == 0) {
              if (local_280 != 10) goto LAB_00123bd9;
              puVar28 = rasterCreateTexture(rw::Raster*)::blockOffset16S;
            }
            else {
              puVar28 = rasterCreateTexture(rw::Raster*)::blockOffset16_4;
            }
          }
          uVar24 = *(uint *)(puVar28 + (ulong)uVar24 * 4);
        }
LAB_00123bd9:
        bufferBase[lVar14] = (ulong)(((int)(uVar35 + 0x3f) >> 6 & 0xffffffe0U) + uVar24);
        uVar24 = ((int)(lVar13 * 0x40 * uVar59 >> 3) * iVar8 >> 2) + uVar35 + 0x3f & 0xffffffc0;
        uVar40 = (long)(int)uVar39 / 2;
        lVar14 = lVar14 + 1;
        local_188 = local_188 + 4;
        uVar16 = uVar59;
        uVar32 = (long)iVar8 / 2 & 0xffffffff;
      }
      lVar13 = 1;
      uVar40 = 8;
      if (uVar33 < 0x32) {
        if ((0x3101008000003U >> local_280 & 1) == 0) {
          if (local_280 == 0x13) {
            uStack_290 = 0x80;
            local_260 = 0x40;
            uVar40 = 0x10;
            uVar32 = 0x10;
          }
          else {
            if (local_280 != 0x14) goto LAB_001249c6;
            local_260 = 0x80;
            uStack_290 = 0x20;
            uVar32 = uStack_290;
            uStack_290 = 0x10;
            uVar40 = uStack_290;
            uStack_290 = 0x80;
          }
        }
        else {
          local_260 = 0x20;
          uVar32 = 8;
          uStack_290 = 0x40;
        }
      }
      else {
LAB_001249c6:
        uStack_290 = 0x40;
        local_260 = 0x40;
        uVar32 = 0x10;
      }
      uVar20 = uVar21;
      if ((int)uVar25 < (int)uVar52) {
        uVar20 = local_258;
      }
      while( true ) {
        if (((uint)uVar20 < 9) || (maxMipLevels <= (int)lVar13)) break;
        uVar20 = (ulong)((uint)uVar20 >> 1);
        lVar13 = lVar13 + 1;
      }
      bufferBase[0] = 0;
      uVar1 = (uint)uStack_290;
      uVar15 = (ulong)(((uVar25 + uVar1) - 1 & -uVar1) >> 6);
      bufferWidth[0] = uVar15;
      uVar24 = (uint)local_260;
      uVar54 = 0;
      bufferHeight_P[0] = (uint32)(((uVar24 + uVar52) - 1) / local_260);
      bufferPage_B[0] = 0;
      local_a0 = (ulong)(uVar1 - 1);
      local_a8 = (ulong)(uVar24 - 1);
      uVar35 = (uint)uVar32;
      iVar58 = uVar35 - 1;
      uVar39 = (uint)uVar40;
      iVar8 = uVar39 - 1;
      lVar14 = 1;
      uVar43 = 0;
      local_23c = 0;
      uVar20 = 0;
      uVar44 = uVar21;
      uVar60 = local_258;
      lVar49 = lVar13;
      while( true ) {
        lVar49 = lVar49 + -1;
        uVar48 = (uint)uVar44;
        uVar10 = (uint)uVar60;
        if (lVar49 == 0) break;
        uVar57 = (uint)(uVar60 >> 1);
        uVar37 = (uint)(uVar44 >> 1);
        uVar19 = uVar20;
        if (uVar10 < uVar1) {
          uVar9 = uVar35;
          if (uVar35 < uVar10) {
            uVar9 = uVar10;
          }
          uVar36 = uVar54 + uVar9;
          iVar56 = (int)uVar20;
          if (uVar48 < uVar24) {
            uVar11 = bufferHeight_P[lVar14 + -1];
            bufferHeight_P[lVar14] = uVar11;
            bufferPage_B[lVar14] = bufferPage_B[lVar14 + -1];
            bufferWidth[lVar14] = bufferWidth[lVar14 + -1];
            if ((ulong)uVar36 < bufferWidth[lVar14 + -1] << 6) {
              widthstack_Px[uVar20] = uVar9;
              uVar54 = uVar39;
              if (uVar39 < uVar48) {
                uVar54 = uVar48;
              }
              heightstack_Px[uVar20] = uVar54;
              uVar16 = bufferBase[lVar14 + -1];
              auStack_d8[uVar20] =
                   (int)((uVar48 + iVar8) / uVar40) * (int)(uStack_290 / uVar32) + (int)uVar16;
              uVar16 = (uVar10 + iVar58) / uVar32 + uVar16;
LAB_00123f88:
              bufferBase[lVar14] = uVar16;
              uVar19 = (ulong)(iVar56 + 1);
              uVar54 = uVar36;
            }
            else {
              uVar10 = uVar39;
              if (uVar39 < uVar48) {
                uVar10 = uVar48;
              }
              if ((uVar10 + uVar43 < uVar11 * uVar24) && (local_23c == 0)) {
                bufferBase[lVar14] =
                     (ulong)(((iVar8 + uVar48) / uVar39) * (int)(uStack_290 / uVar32)) +
                     bufferBase[lVar14 + -1];
                local_23c = (int)lVar14;
                uVar43 = uVar43 + uVar48;
              }
              else {
                uVar19 = (ulong)(iVar56 - 1);
                uVar48 = uVar35;
                if (uVar35 < uVar57) {
                  uVar48 = uVar57;
                }
                uVar10 = auStack_d8[uVar19];
                bufferBase[lVar14] = (ulong)uVar10;
                uVar11 = widthstack_Px[uVar19] - uVar48;
                if (widthstack_Px[uVar19] < uVar48 || uVar11 == 0) {
                  uVar48 = uVar39;
                  if (uVar39 < uVar37) {
                    uVar48 = uVar37;
                  }
                  uVar11 = heightstack_Px[uVar19] - uVar48;
                  if (uVar48 <= heightstack_Px[uVar19] && uVar11 != 0) {
                    auStack_d8[uVar19] =
                         (int)((iVar8 + uVar37) / uVar40) * (int)(uStack_290 / uVar32) + uVar10;
                    heightstack_Px[uVar19] = uVar11;
                    uVar19 = uVar20;
                  }
                }
                else {
                  auStack_d8[uVar19] = (int)((iVar58 + uVar57) / uVar32) + uVar10;
                  widthstack_Px[uVar19] = uVar11;
                  uVar19 = uVar20;
                }
              }
            }
          }
          else {
            bufferPage_B[lVar14] = bufferPage_B[lVar14 + -1];
            bufferHeight_P[lVar14] = bufferHeight_P[lVar14 + -1];
            bufferWidth[lVar14] = bufferWidth[lVar14 + -1];
            if (uVar36 < uVar1) {
              heightstack_Px[uVar20] = uVar48;
              widthstack_Px[uVar20] = uVar9;
              uVar16 = bufferBase[lVar14 + -1];
              auStack_d8[uVar20] =
                   (int)(uStack_290 / uVar32) * ((uVar48 + iVar8) / uVar39) + (int)uVar16;
              uVar16 = (uVar10 + iVar58) / uVar32 + uVar16;
              goto LAB_00123f88;
            }
            if (iVar56 == 0) {
              bufferBase[lVar14] =
                   (ulong)(((uVar48 + iVar8) / uVar39) * (int)(uStack_290 / uVar32)) +
                   bufferBase[lVar14 + -1];
              uVar19 = 0;
              uVar43 = uVar43 + uVar48;
            }
            else {
              uVar19 = (ulong)(iVar56 - 1);
              uVar48 = uVar35;
              if (uVar35 < uVar57) {
                uVar48 = uVar57;
              }
              uVar10 = auStack_d8[uVar19];
              bufferBase[lVar14] = (ulong)uVar10;
              uVar11 = widthstack_Px[uVar19] - uVar48;
              if (widthstack_Px[uVar19] < uVar48 || uVar11 == 0) {
                uVar48 = uVar39;
                if (uVar39 < uVar37) {
                  uVar48 = uVar37;
                }
                uVar11 = heightstack_Px[uVar19] - uVar48;
                if (heightstack_Px[uVar19] < uVar48 || uVar11 == 0) {
                  local_23c = 1;
                }
                else {
                  auStack_d8[uVar19] =
                       (int)(uStack_290 / uVar32) * (int)((iVar8 + uVar37) / uVar40) + uVar10;
                  heightstack_Px[uVar19] = uVar11;
                  local_23c = 1;
                  uVar19 = uVar20;
                }
              }
              else {
                auStack_d8[uVar19] = (int)((iVar58 + uVar57) / uVar32) + uVar10;
                widthstack_Px[uVar19] = uVar11;
                local_23c = 1;
                uVar19 = uVar20;
              }
            }
          }
        }
        else if (uVar48 < uVar24) {
          bufferPage_B[lVar14] = bufferPage_B[lVar14 + -1];
          bufferHeight_P[lVar14] = bufferHeight_P[lVar14 + -1];
          uVar37 = uVar39;
          if (uVar39 < uVar48) {
            uVar37 = uVar48;
          }
          bufferWidth[lVar14] = bufferWidth[lVar14 + -1];
          if (uVar37 + uVar43 < uVar24) {
            bufferBase[lVar14] =
                 ((ulong)(uint)((int)((uVar48 + iVar8) / uVar40) * (int)(uStack_290 / uVar32)) *
                  bufferWidth[lVar14 + -1] * 0x40) / uStack_290 + bufferBase[lVar14 + -1];
            uVar43 = uVar37 + uVar43;
          }
          else {
            uVar54 = uVar54 + uVar10;
            bufferBase[lVar14] = (uVar10 + iVar58) / uVar32 + bufferBase[lVar14 + -1];
          }
        }
        else {
          uVar54 = 0;
          uVar16 = (ulong)(uint)((int)(uVar44 / uVar40) * (int)(uVar60 / uVar32)) +
                   bufferBase[lVar14 + -1];
          bufferBase[lVar14] = uVar16;
          bufferPage_B[lVar14] = (uint32)uVar16;
          bufferWidth[lVar14] = (ulong)(((int)local_a0 + uVar57 & -uVar1) >> 6);
          bufferHeight_P[lVar14] = ((int)local_a8 + uVar37) / uVar24;
          uVar43 = 0;
        }
        lVar14 = lVar14 + 1;
        uVar20 = uVar19;
        uVar44 = uVar44 >> 1;
        uVar60 = uVar60 >> 1;
      }
      uVar20 = bufferWidth[lVar13 + -1] << 6;
      uVar1 = bufferHeight_P[lVar13 + -1];
      if ((uVar20 == uVar60) && (uVar1 * uVar24 == uVar48)) {
        if (uVar33 - 0x13 < 2) {
          uVar24 = (int)(uVar44 / uVar40) * (int)((uVar20 & 0xffffffff) / uVar32) +
                   bufferPage_B[lVar13 + -1];
        }
        else {
          uVar24 = 0;
        }
      }
      else if (uVar33 == 0x14) {
        uVar24 = ((int)(uVar20 / uStack_290) * uVar1 * 0x20 + bufferPage_B[lVar13 + -1]) - 1;
      }
      else if (uVar33 == 0x13) {
        uVar24 = (((int)(uVar20 / uStack_290) * uVar1 * 0x20 + bufferPage_B[lVar13 + -1]) -
                 (int)(uStack_290 / uVar32) * (int)((uVar1 * uVar24) / uStack_290)) - 2;
      }
      else {
        uVar24 = 0;
      }
      lVar49 = 0;
      iVar58 = 0;
      lVar14 = lVar13;
      while( true ) {
        bVar61 = lVar14 == 0;
        lVar14 = lVar14 + -1;
        iVar8 = (int)uVar15;
        if (bVar61) break;
        uVar44 = *(ulong *)((long)bufferBase + lVar49 * 2);
        uVar43 = (uint)uVar44;
        uVar54 = (uVar43 - iVar58) * uVar35;
        uVar48 = iVar8 << 6;
        uVar60 = *(ulong *)((long)bufferWidth + lVar49 * 2);
        if ((uVar60 == uVar15) && (uVar10 = (uVar54 / uVar48) * uVar39, uVar10 < 0x800)) {
          uVar54 = uVar54 % uVar48 | uVar10 * 0x10000;
        }
        else {
          iVar58 = *(int *)((long)bufferPage_B + lVar49);
          uVar48 = (int)uVar60 << 6;
          uVar54 = 0;
          uVar15 = uVar60 & 0xffffffff;
        }
        *(uint *)((long)trxpos_hi + lVar49) = uVar54;
        if (1 < (uint)(uVar48 / uStack_290)) {
          uVar60 = (uint)((int)uVar15 << 0xb) / uStack_290;
          uVar19 = uVar48 / uVar32;
          uVar2 = uStack_290 / uVar32;
          uVar54 = (uint)uVar60;
          uVar44 = (ulong)(uVar54 - (int)uVar19 & uVar43) / (uVar19 / uVar2) |
                   (uVar60 / uVar19) * (ulong)(uVar43 & (int)uVar19 - (int)uVar2) |
                   (long)(int)~uVar54 + uVar2 & uVar44;
          *(ulong *)((long)bufferBase + lVar49 * 2) = uVar44;
        }
        if (uVar33 < 0x2d) {
          puVar28 = blockmap_PSMCT32;
          if ((0x101008080003U >> local_280 & 1) == 0) {
            if ((0x100004UL >> local_280 & 1) == 0) {
              if (local_280 != 10) goto LAB_001245a7;
              puVar28 = blockmap_PSMCT16S;
            }
            else {
              puVar28 = blockmap_PSMCT16;
            }
          }
          *(ulong *)((long)bufferBase + lVar49 * 2) =
               (ulong)(byte)puVar28[(uint)uVar44 & 0x1f] | uVar44 & 0xffffffffffffffe0;
        }
LAB_001245a7:
        lVar49 = lVar49 + 4;
      }
      if (1 < (uint)((uint)(iVar8 << 6) / uStack_290)) {
        uVar44 = (uint)(iVar8 << 0xb) / uStack_290;
        uVar60 = (uint)(iVar8 << 6) / uVar32;
        iVar58 = (int)(uStack_290 / uVar32);
        uVar35 = (uint)uVar44;
        uVar24 = (uint)((ulong)(uVar35 - (int)uVar60 & uVar24) / (uVar60 / (uStack_290 / uVar32))) |
                 (int)(uVar44 / uVar60) * ((int)uVar60 - iVar58 & uVar24) |
                 ~uVar35 + iVar58 & uVar24;
      }
      if (uVar33 < 0x2d) {
        if ((0x101008080003U >> local_280 & 1) == 0) {
          if ((0x100004UL >> local_280 & 1) == 0) {
            if (local_280 != 10) goto LAB_001246a9;
            puVar28 = blockmap_PSMCT16S;
          }
          else {
            puVar28 = blockmap_PSMCT16;
          }
        }
        else {
          puVar28 = blockmap_PSMCT32;
        }
        uVar24 = (uint)(byte)puVar28[uVar24 & 0x1f] | uVar24 & 0xffffffe0;
      }
LAB_001246a9:
      iVar58 = ((int)(((uVar20 / uVar32) * uVar1 * local_260) / uVar40) + bufferPage_B[lVar13 + -1])
               * 0x40;
      iVar51 = local_230 * iVar38 * iVar3;
      *(int *)(&raster->field_0x24 + lVar30) = iVar51;
      *(uint64 *)((long)&raster->format + lVar30) =
           (bufferBase[3] & 0x3fff) << 0x28 |
           bufferWidth[3] << 0x36 | (bufferBase[2] & 0x3fff) << 0x14 |
           bufferWidth[2] << 0x22 | bufferBase[1] & 0x3fff | bufferWidth[1] << 0xe;
      *(uint64 *)((long)&raster->height + lVar30) =
           (bufferBase[6] & 0x3fff) << 0x28 |
           bufferWidth[6] << 0x36 | (bufferBase[5] & 0x3fff) << 0x14 |
           bufferWidth[5] << 0x22 | bufferBase[4] & 0x3fff | bufferWidth[4] << 0xe;
      *(byte *)((long)&raster->privateFlags + lVar30 + 2) = local_188;
      *(int *)((long)&raster->pixels + lVar30) = iVar58;
      if (iVar51 == 0) {
        *(undefined4 *)((long)&raster->flags + lVar30) = 0;
        iVar51 = 0;
        uVar24 = 0;
      }
      else {
        *(uint *)((long)&raster->flags + lVar30) = uVar24;
        if (uVar24 << 6 == iVar58) {
          *(int *)((long)&raster->pixels + lVar30) = iVar58 + 0x800;
        }
      }
    }
    else {
      iVar51 = local_230 * iVar38 * iVar3;
      *(int *)(&raster->field_0x24 + lVar30) = iVar51;
      *(undefined8 *)((long)&raster->format + lVar30) = 0x40000400004000;
      *(undefined8 *)((long)&raster->height + lVar30) = 0x40000400004000;
      *(undefined1 *)((long)&raster->privateFlags + lVar30 + 2) = 0;
      iVar47 = (int)(uVar25 + uVar1 + -1) / (int)uVar1;
      iVar42 = (int)(uVar52 + iVar58 + -1) / iVar58;
      bufferBase[0] = 0;
      trxpos_hi[0] = 0;
      uVar34 = iVar7 * uVar52 + 0xf & 0xfffffff0;
      iVar7 = uVar1 * iVar47;
      bufferWidth[0] = (long)(iVar7 / 0x40);
      iVar47 = iVar47 * iVar42;
      uVar24 = iVar47 * 0x800;
      *(uint *)((long)&raster->pixels + lVar30) = uVar24;
      if (iVar51 == 0) {
        *(undefined4 *)((long)&raster->flags + lVar30) = 0;
        iVar51 = 0;
        uVar24 = 0;
      }
      else if (((int)uVar25 < iVar7) || ((int)uVar52 < iVar42 * iVar58)) {
        uVar24 = uVar24 - 0x100 >> 6;
        *(uint *)((long)&raster->flags + lVar30) = uVar24;
      }
      else {
        uVar24 = uVar24 >> 6;
        *(uint *)((long)&raster->flags + lVar30) = uVar24;
        *(int *)((long)&raster->pixels + lVar30) =
             (((iVar3 + iVar8 + -1) / iVar8) * ((local_230 + iVar56 + -1) / iVar56) + iVar47) *
             0x800;
      }
      local_188 = 0;
    }
    *(ulong *)((long)&raster->platform + lVar30) =
         local_1f8 | local_200 | lVar53 << 0x33 | uVar18 | uVar27 | (long)((int)uVar6 / 0x40) << 0xe
         | (ulong)(uVar33 << 0x14);
    *(uint *)((long)&raster->stride + lVar30) = uVar34;
    if ((noNewStyleRasters == 0) && ((int)(uVar52 * uVar25 * iVar29) < 0x3fff80)) {
      local_188 = local_188 >> 2;
      bVar31 = local_188 + 1;
      *(undefined1 *)((long)&raster->pixels + lVar30 + 4) = 1;
      if (uVar33 == 0x13) {
        uVar25 = trxpos_hi[local_188];
        *(undefined1 *)((long)&raster->pixels + lVar30 + 4) = 3;
        bVar4 = 3;
        if (((char)local_b0 == '\0') || (bufferWidth[local_188] != 2)) {
          local_288 = 0;
        }
        else {
          uVar25 = (((uVar25 >> 4 & 0x7f) + (uVar25 >> 0x11 & 0x3f8)) -
                   ((uint)(byte)blockmaprev_PSMCT32[(uint)bufferBase[local_188] & 0x1f] |
                   (uint)bufferBase[local_188] & 0xffffffe0)) +
                   ((uint)(byte)blockmaprev_PSMCT32[uVar24 & 0x1f] | uVar24 & 0xffffffe0);
          if (uVar25 < 0x800) {
            local_288 = (ulong)((uVar25 & 0x7f8) * 0x10000 + (uVar25 & 7) * 8);
          }
          else {
            local_288 = 0;
          }
        }
      }
      else {
        bVar4 = 1;
        local_288 = 0;
      }
      if ((uVar33 == 0x14) && (0x31000 < version)) {
        bVar4 = bVar4 | 4;
        *(byte *)((long)&raster->pixels + lVar30 + 4) = bVar4;
      }
      uVar25 = (uint)bVar31;
      iVar58 = uVar25 * 0x50;
      transferMinSize(uVar33,(uint)bVar4,(int32 *)bufferHeight_P,(int32 *)bufferPage_B);
      while (bVar61 = uVar25 != 0, uVar25 = uVar25 - 1, bVar61) {
        uVar12 = (uint32)local_258;
        uVar11 = bufferHeight_P[0];
        if ((int)bufferHeight_P[0] < (int)uVar12) {
          uVar11 = uVar12;
        }
        uVar41 = (uint32)uVar21;
        uVar26 = bufferPage_B[0];
        if ((int)bufferPage_B[0] < (int)uVar41) {
          uVar26 = uVar41;
        }
        iVar58 = iVar58 + ((int)(uVar11 * iVar29 * uVar26) / 8 + 0xfU & 0xfffffff0);
        local_258 = (long)(int)uVar12 / 2 & 0xffffffff;
        uVar21 = (long)(int)uVar41 / 2 & 0xffffffff;
      }
      *(int *)((long)&raster->stride + lVar30) = iVar58;
      iVar29 = 0;
      if (iVar51 == 0) {
        iVar38 = 0;
      }
      else {
        iVar8 = 3;
        if (version < 0x31001) {
          iVar8 = iVar3;
        }
        if (iVar3 != 2) {
          iVar8 = iVar3;
        }
        iVar3 = iVar8;
        iVar38 = iVar38 * local_230 * iVar3 + 0x50;
        *(int *)(&raster->field_0x24 + lVar30) = iVar38;
      }
      uVar25 = 0x10;
      for (uVar21 = 0; bVar31 != uVar21; uVar21 = uVar21 + 1) {
        uVar52 = uVar25 + 0x40;
        if (trxpos_hi[uVar21] != 0) {
          uVar52 = uVar25;
        }
        iVar29 = iVar29 + (uint)(trxpos_hi[uVar21] == 0);
        uVar25 = uVar52;
      }
      uVar52 = uVar25 + 0x40;
      iVar29 = iVar29 + (uint)(iVar38 != 0);
      if ((iVar38 == 0) || (uVar25 = uVar52, local_288 != 0)) {
        uVar52 = uVar25;
        uVar25 = iVar38 + iVar58 + 0x3fU & 0xffffffc0;
      }
      else {
        uVar25 = (iVar38 + 0x3fU & 0xffffffc0) + (iVar58 + 0x7fU & 0xffffff80);
      }
      uVar25 = uVar52 + uVar25 + 0x70;
      *(uint *)((long)&raster->originalPixels + lVar30) = uVar25;
      plVar17 = (long *)mallocalign((ulong)uVar25,0x40);
      *(long **)((long)&raster->palette + lVar30) = plVar17;
      *(int *)(plVar17 + 1) = iVar29;
      *(int *)((long)plVar17 + 0xc) = iVar29;
      puVar45 = (undefined8 *)((long)plVar17 + (ulong)uVar52 + 0x7f & 0xffffffffffffff80);
      *plVar17 = (long)puVar45;
      raster->pixels = (uint8 *)plVar17;
      if (*(int *)(&raster->field_0x24 + lVar30) != 0) {
        raster->palette =
             (uint8 *)((long)puVar45 +
                      (ulong)(*(int *)((long)&raster->stride + lVar30) + 0x7fU & 0xffffff80) + 0x50)
        ;
      }
      plVar50 = plVar17 + 2;
      uVar11 = raster->width;
      uVar12 = raster->height;
      bVar4 = *(byte *)((long)&raster->pixels + lVar30 + 4);
      bVar55 = (byte)((bVar4 & 2) >> 1) & local_280 == 0x13;
      bVar23 = (byte)((bVar4 & 4) >> 2) & local_280 == 0x14;
      for (uVar21 = 0; bVar31 != uVar21; uVar21 = uVar21 + 1) {
        uVar26 = bufferHeight_P[0];
        if ((int)bufferHeight_P[0] < (int)uVar11) {
          uVar26 = uVar11;
        }
        uVar41 = bufferPage_B[0];
        if ((int)bufferPage_B[0] < (int)uVar12) {
          uVar41 = uVar12;
        }
        *puVar45 = 0x1000000000000003;
        puVar45[1] = 0xe;
        if (bVar55 == 0 && bVar23 == 0) {
          *(undefined4 *)(puVar45 + 2) = 0;
          uVar25 = trxpos_hi[uVar21];
          *(uint *)((long)puVar45 + 0x14) = uVar25;
          puVar45[3] = 0x51;
LAB_00124c8c:
          if ((uVar33 == 0x14) && ((bVar4 & 4) != 0)) goto LAB_00124c9a;
          *(uint32 *)(puVar45 + 4) = uVar26;
          *(uint32 *)((long)puVar45 + 0x24) = uVar41;
        }
        else {
          *(undefined4 *)(puVar45 + 2) = 0;
          uVar25 = trxpos_hi[uVar21];
          *(uint *)((long)puVar45 + 0x14) = uVar25 >> 1 & 0x7fff7fff;
          puVar45[3] = 0x51;
          if (bVar55 == 0) goto LAB_00124c8c;
LAB_00124c9a:
          *(int *)(puVar45 + 4) = (int)uVar26 / 2;
          *(int *)((long)puVar45 + 0x24) = (int)uVar41 / 2;
          uVar25 = trxpos_hi[uVar21];
        }
        puVar45[5] = 0x52;
        puVar45[6] = 0;
        puVar45[7] = 0x53;
        uVar52 = (int)(uVar41 * uVar26 * raster->depth) / 8 + 0xf >> 4;
        *(uint *)(puVar45 + 8) = uVar52 & 0x7fff;
        *(undefined8 *)((long)puVar45 + 0x44) = 0x8000000;
        *(undefined4 *)((long)puVar45 + 0x4c) = 0;
        if (uVar25 == 0) {
          *plVar50 = 0x10000002;
          plVar50[1] = 0x5000000200000000;
          plVar50[2] = 0x1000000000000001;
          plVar50[3] = 0xe;
          if (bVar55 == 0) {
            if (bVar23 == 0) {
              uVar25 = (uint)bufferWidth[uVar21] << 0x10;
              *(uint *)(plVar50 + 4) = uVar25 | uVar33 << 0x18;
              *(uint *)((long)plVar50 + 0x24) = (uint)bufferBase[uVar21] | uVar33 << 0x18 | uVar25;
            }
            else {
              uVar25 = ((uint)bufferWidth[uVar21] & 0x1fbfe) << 0xf | 0x2000000;
              *(uint *)(plVar50 + 4) = uVar25;
              *(uint *)((long)plVar50 + 0x24) = uVar25 | (uint)bufferBase[uVar21];
            }
          }
          else {
            uVar25 = ((uint)bufferWidth[uVar21] & 0xfffffffe) << 0xf;
            *(uint *)(plVar50 + 4) = uVar25;
            *(uint *)((long)plVar50 + 0x24) = uVar25 | (uint)bufferBase[uVar21];
          }
          plVar50[5] = 0x50;
          *(uint *)(plVar50 + 6) = uVar52 + 5 | 0x30000000;
          *(int *)((long)plVar50 + 0x34) = (int)puVar45;
          *(undefined4 *)(plVar50 + 7) = 0;
          *(uint *)((long)plVar50 + 0x3c) = uVar52 + 5 | 0x50000000;
          plVar50 = plVar50 + 8;
        }
        else {
          *(uint *)(plVar50 + -2) = *(ushort *)(plVar50 + -2) + uVar52 + 5 | 0x30000000;
          *(uint *)((long)plVar50 + -4) = *(ushort *)((long)plVar50 + -4) + uVar52 + 5 | 0x50000000;
        }
        puVar45 = (undefined8 *)((long)puVar45 + (ulong)(uVar52 << 2) * 4 + 0x50);
        uVar11 = (int)uVar11 / 2;
        uVar12 = (int)uVar12 / 2;
      }
      if (*(int *)(&raster->field_0x24 + lVar30) != 0) {
        if (local_288 == 0) {
          puVar46 = raster->palette;
        }
        else {
          puVar46 = (uint8 *)(puVar45 + 10);
          raster->palette = puVar46;
        }
        puVar46[-0x50] = '\x03';
        puVar46[-0x4f] = '\0';
        puVar46[-0x4e] = '\0';
        puVar46[-0x4d] = '\0';
        puVar46[-0x4c] = '\0';
        puVar46[-0x4b] = '\0';
        puVar46[-0x4a] = '\0';
        puVar46[-0x49] = '\x10';
        puVar46[-0x48] = '\x0e';
        puVar46[-0x47] = '\0';
        puVar46[-0x46] = '\0';
        puVar46[-0x45] = '\0';
        puVar46[-0x44] = '\0';
        puVar46[-0x43] = '\0';
        puVar46[-0x42] = '\0';
        puVar46[-0x41] = '\0';
        *(ulong *)(puVar46 + -0x40) = local_288;
        puVar46[-0x38] = 'Q';
        puVar46[-0x37] = '\0';
        puVar46[-0x36] = '\0';
        puVar46[-0x35] = '\0';
        puVar46[-0x34] = '\0';
        puVar46[-0x33] = '\0';
        puVar46[-0x32] = '\0';
        puVar46[-0x31] = '\0';
        *(int *)(puVar46 + -0x30) = local_230;
        *(int *)(puVar46 + -0x2c) = iVar3;
        puVar46[-0x28] = 'R';
        puVar46[-0x27] = '\0';
        puVar46[-0x26] = '\0';
        puVar46[-0x25] = '\0';
        puVar46[-0x24] = '\0';
        puVar46[-0x23] = '\0';
        puVar46[-0x22] = '\0';
        puVar46[-0x21] = '\0';
        puVar46[-0x20] = '\0';
        puVar46[-0x1f] = '\0';
        puVar46[-0x1e] = '\0';
        puVar46[-0x1d] = '\0';
        puVar46[-0x1c] = '\0';
        puVar46[-0x1b] = '\0';
        puVar46[-0x1a] = '\0';
        puVar46[-0x19] = '\0';
        puVar46[-0x18] = 'S';
        puVar46[-0x17] = '\0';
        puVar46[-0x16] = '\0';
        puVar46[-0x15] = '\0';
        puVar46[-0x14] = '\0';
        puVar46[-0x13] = '\0';
        puVar46[-0x12] = '\0';
        puVar46[-0x11] = '\0';
        uVar25 = *(int *)(&raster->field_0x24 + lVar30) - 0x41U >> 4;
        puVar46[-4] = '\0';
        puVar46[-3] = '\0';
        puVar46[-2] = '\0';
        puVar46[-1] = '\0';
        *(uint *)(puVar46 + -0x10) = uVar25 & 0x7fff;
        puVar46[-0xc] = '\0';
        puVar46[-0xb] = '\0';
        puVar46[-10] = '\0';
        puVar46[-9] = '\b';
        puVar46[-8] = '\0';
        puVar46[-7] = '\0';
        puVar46[-6] = '\0';
        puVar46[-5] = '\0';
        *plVar50 = 0x10000002;
        plVar50[1] = 0x5000000200000000;
        plVar50[2] = 0x1000000000000001;
        plVar50[3] = 0xe;
        if (local_288 == 0) {
          uVar52 = (int)lVar53 << 0x18 | 0x10000;
          *(uint *)(plVar50 + 4) = uVar52;
          *(uint *)((long)plVar50 + 0x24) = uVar52 | *(uint *)((long)&raster->flags + lVar30);
          plVar50[5] = 0x50;
        }
        else {
          plVar50[4] = plVar50[-4];
          plVar50[5] = plVar50[-3];
          *(uint *)(plVar50 + -4) = *(ushort *)(plVar50 + -4) + uVar25 + 5 | 0x30000000;
          *(uint *)((long)plVar50 + -0x14) =
               *(ushort *)((long)plVar50 + -0x14) + uVar25 + 5 | 0x50000000;
          *(int *)(plVar17 + 1) = (int)plVar17[1] + -1;
        }
        *(uint *)(plVar50 + 6) = uVar25 + 5 | 0x30000000;
        *(int *)((long)plVar50 + 0x34) = (int)puVar46 + -0x50;
        *(undefined4 *)(plVar50 + 7) = 0;
        *(uint *)((long)plVar50 + 0x3c) = uVar25 + 5 | 0x50000000;
      }
      bVar31 = *(byte *)((long)&raster->pixels + lVar30 + 4);
    }
    else {
      *(uint *)((long)&raster->originalPixels + lVar30) = uVar34 + iVar51;
      plVar17 = (long *)mallocalign((ulong)(uVar34 + iVar51),0x40);
      *(long **)((long)&raster->palette + lVar30) = plVar17;
      raster->pixels = (uint8 *)plVar17;
      if (*(int *)(&raster->field_0x24 + lVar30) != 0) {
        raster->palette =
             (uint8 *)((ulong)*(uint *)((long)&raster->stride + lVar30) + (long)plVar17);
      }
      bVar31 = *(byte *)((long)&raster->pixels + lVar30 + 4);
      if (raster->depth == 8) {
        bVar31 = bVar31 | 2;
        *(byte *)((long)&raster->pixels + lVar30 + 4) = bVar31;
      }
    }
    raster->originalPixels = (uint8 *)plVar17;
    raster->originalStride = raster->stride;
    pRVar22 = raster;
    if ((bVar31 & 1) != 0) {
      raster->pixels = (uint8 *)(*plVar17 + 0x50);
    }
    break;
  case 1:
  case 2:
    raster->flags = 0x80;
    pRVar22 = raster;
  }
switchD_00123688_caseD_3:
  return pRVar22;
}

Assistant:

Raster*
rasterCreate(Raster *raster)
{
	if(!getRasterFormat(raster))
		return nil;

	// init raster
	raster->pixels = nil;
	raster->palette = nil;
	raster->originalWidth = raster->width;
	raster->originalHeight = raster->height;
	raster->originalPixels = raster->pixels;
	if(raster->width == 0 || raster->height == 0){
		raster->flags = Raster::DONTALLOCATE;
		raster->stride = 0;
		raster->originalStride = 0;
		return raster;
	}

	switch(raster->type){
	case Raster::NORMAL:
	case Raster::TEXTURE:
		return rasterCreateTexture(raster);
	case Raster::ZBUFFER:
		// TODO. only RW_PS2
		// get info from video mode
		raster->flags = Raster::DONTALLOCATE;
		return raster;
	case Raster::CAMERA:
		// TODO. only RW_PS2
		// get info from video mode
		raster->flags = Raster::DONTALLOCATE;
		return raster;
	case Raster::CAMERATEXTURE:
		// TODO. only RW_PS2
		// check width/height and fall through to texture
		return nil;
	}
	return nil;
}